

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

bool __thiscall
LoopCrosser::HasCrossing(LoopCrosser *this,RangeIterator_conflict *ai,RangeIterator_conflict *bi)

{
  S2ShapeIndexCell *this_00;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  S2ClippedShape *pSVar4;
  S2CellId x;
  S2CellId y;
  reference ppSVar5;
  S2ClippedShape *b_clipped;
  S2ShapeIndexCell *b_cell;
  iterator __end1;
  iterator __begin1;
  vector<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_> *__range1;
  S2ShapeIndexCell *local_78;
  uint64 local_70;
  int local_68;
  int total_edges;
  byte local_51;
  S2LogMessage local_50;
  S2LogMessageVoidify local_39;
  uint64 local_38;
  S2CellId local_30;
  RangeIterator_conflict *local_28;
  RangeIterator_conflict *bi_local;
  RangeIterator_conflict *ai_local;
  LoopCrosser *this_local;
  
  local_28 = bi;
  bi_local = ai;
  ai_local = (RangeIterator_conflict *)this;
  local_30 = RangeIterator::id((RangeIterator *)ai);
  local_38 = (uint64)RangeIterator::id((RangeIterator *)local_28);
  bVar1 = S2CellId::contains(&local_30,(S2CellId)local_38);
  local_51 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.cc"
               ,0x38e,kFatal,(ostream *)&std::cerr);
    local_51 = 1;
    poVar3 = S2LogMessage::stream(&local_50);
    poVar3 = std::operator<<(poVar3,"Check failed: ai->id().contains(bi->id()) ");
    S2LogMessageVoidify::operator&(&local_39,poVar3);
  }
  if ((local_51 & 1) == 0) {
    local_68 = 0;
    std::vector<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>::clear
              (&this->b_cells_);
    do {
      iVar2 = RangeIterator::num_edges((RangeIterator *)local_28);
      if (0 < iVar2) {
        iVar2 = RangeIterator::num_edges((RangeIterator *)local_28);
        local_68 = iVar2 + local_68;
        if (0x13 < local_68) {
          pSVar4 = RangeIterator::clipped((RangeIterator *)bi_local);
          local_70 = (uint64)RangeIterator::id((RangeIterator *)bi_local);
          bVar1 = CellCrossesAnySubcell(this,pSVar4,(S2CellId)local_70);
          if (!bVar1) {
            RangeIterator::SeekBeyond((RangeIterator *)local_28,bi_local);
            return false;
          }
          return true;
        }
        local_78 = RangeIterator::cell((RangeIterator *)local_28);
        std::vector<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>::push_back
                  (&this->b_cells_,&local_78);
      }
      RangeIterator::Next((RangeIterator *)local_28);
      x = RangeIterator::id((RangeIterator *)local_28);
      y = RangeIterator::range_max((RangeIterator *)bi_local);
      bVar1 = operator<=(x,y);
    } while (bVar1);
    __end1 = std::vector<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>::begin
                       (&this->b_cells_);
    b_cell = (S2ShapeIndexCell *)
             std::vector<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>::end
                       (&this->b_cells_);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<const_S2ShapeIndexCell_**,_std::vector<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>_>
                                  *)&b_cell);
      if (!bVar1) {
        return false;
      }
      ppSVar5 = __gnu_cxx::
                __normal_iterator<const_S2ShapeIndexCell_**,_std::vector<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>_>
                ::operator*(&__end1);
      this_00 = *ppSVar5;
      pSVar4 = RangeIterator::clipped((RangeIterator *)bi_local);
      b_clipped = S2ShapeIndexCell::clipped(this_00,0);
      bVar1 = CellCrossesCell(this,pSVar4,b_clipped);
      if (bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_S2ShapeIndexCell_**,_std::vector<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>_>
      ::operator++(&__end1);
    }
    return true;
  }
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_50);
}

Assistant:

bool LoopCrosser::HasCrossing(RangeIterator* ai, RangeIterator* bi) {
  S2_DCHECK(ai->id().contains(bi->id()));
  // If ai->id() intersects many edges of B, then it is faster to use
  // S2CrossingEdgeQuery to narrow down the candidates.  But if it intersects
  // only a few edges, it is faster to check all the crossings directly.
  // We handle this by advancing "bi" and keeping track of how many edges we
  // would need to test.

  static const int kEdgeQueryMinEdges = 20;  // Tuned using benchmarks.
  int total_edges = 0;
  b_cells_.clear();
  do {
    if (bi->num_edges() > 0) {
      total_edges += bi->num_edges();
      if (total_edges >= kEdgeQueryMinEdges) {
        // There are too many edges to test them directly, so use
        // S2CrossingEdgeQuery.
        if (CellCrossesAnySubcell(ai->clipped(), ai->id())) return true;
        bi->SeekBeyond(*ai);
        return false;
      }
      b_cells_.push_back(&bi->cell());
    }
    bi->Next();
  } while (bi->id() <= ai->range_max());

  // Test all the edge crossings directly.
  for (const S2ShapeIndexCell* b_cell : b_cells_) {
    if (CellCrossesCell(ai->clipped(), b_cell->clipped(0))) {
      return true;
    }
  }
  return false;
}